

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-hang-loop.c
# Opt level: O3

int run_test_udp_send_hang_loop(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *unaff_RBX;
  uv_idle_t *puVar3;
  uv_udp_send_t *puVar4;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_40 [40];
  void *local_18;
  void *local_10;
  
  auStack_40._32_8_ = (void *)0x1e135a;
  uVar2 = uv_default_loop();
  auStack_40._32_8_ = (void *)0x1e1369;
  iVar1 = uv_idle_init(uVar2,&idle_handle);
  local_10 = (void *)(long)iVar1;
  local_18 = (void *)0x0;
  if (local_10 == (void *)0x0) {
    auStack_40._32_8_ = (void *)0x1e139f;
    iVar1 = uv_ip4_addr("192.0.2.3",0x23a3,&addr);
    local_10 = (void *)(long)iVar1;
    local_18 = (void *)0x0;
    if (local_10 != (void *)0x0) goto LAB_001e14d5;
    auStack_40._32_8_ = (void *)0x1e13c2;
    uVar2 = uv_default_loop();
    auStack_40._32_8_ = (void *)0x1e13d1;
    iVar1 = uv_udp_init(uVar2,&client);
    local_10 = (void *)(long)iVar1;
    local_18 = (void *)0x0;
    if (local_10 != (void *)0x0) goto LAB_001e14e2;
    auStack_40._32_8_ = (void *)0x1e1400;
    buf = (uv_buf_t)uv_buf_init(send_data,0x400);
    auStack_40._32_8_ = (void *)0x1e1421;
    iVar1 = uv_idle_start(&idle_handle,idle_cb);
    local_10 = (void *)(long)iVar1;
    local_18 = (void *)0x0;
    if (local_10 != (void *)0x0) goto LAB_001e14ef;
    auStack_40._32_8_ = (void *)0x1e1444;
    uVar2 = uv_default_loop();
    auStack_40._32_8_ = (void *)0x1e144e;
    uv_run(uVar2,0);
    local_10 = (void *)(long)loop_hang_called;
    local_18 = (void *)0x3e8;
    if ((long)local_10 < 0x3e9) goto LAB_001e14fc;
    auStack_40._32_8_ = (void *)0x1e1476;
    unaff_RBX = (uv_loop_t *)uv_default_loop();
    auStack_40._32_8_ = (void *)0x1e148a;
    uv_walk(unaff_RBX,close_walk_cb,0);
    auStack_40._32_8_ = (void *)0x1e1494;
    uv_run(unaff_RBX,0);
    local_10 = (void *)0x0;
    auStack_40._32_8_ = (void *)0x1e14a2;
    uVar2 = uv_default_loop();
    auStack_40._32_8_ = (void *)0x1e14aa;
    iVar1 = uv_loop_close(uVar2);
    local_18 = (void *)(long)iVar1;
    if (local_10 == local_18) {
      auStack_40._32_8_ = (void *)0x1e14c0;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_40._32_8_ = (void *)0x1e14d5;
    run_test_udp_send_hang_loop_cold_1();
LAB_001e14d5:
    auStack_40._32_8_ = (void *)0x1e14e2;
    run_test_udp_send_hang_loop_cold_2();
LAB_001e14e2:
    auStack_40._32_8_ = (void *)0x1e14ef;
    run_test_udp_send_hang_loop_cold_3();
LAB_001e14ef:
    auStack_40._32_8_ = (void *)0x1e14fc;
    run_test_udp_send_hang_loop_cold_4();
LAB_001e14fc:
    auStack_40._32_8_ = (void *)0x1e1509;
    run_test_udp_send_hang_loop_cold_5();
  }
  puVar3 = (uv_idle_t *)&stack0xfffffffffffffff0;
  auStack_40._32_8_ = idle_cb;
  run_test_udp_send_hang_loop_cold_6();
  if (send_req.handle == (uv_udp_t *)0x0) {
    if (puVar3 != &idle_handle) goto LAB_001e15f2;
    auStack_40._8_8_ = (uv_loop_t *)0x1e1546;
    iVar1 = uv_idle_stop(&idle_handle);
    auStack_40._32_8_ = SEXT48(iVar1);
    auStack_40._24_8_ = (void *)0x0;
    if ((code *)auStack_40._32_8_ != (code *)0x0) goto LAB_001e15f7;
    if (999 < loop_hang_called) {
      auStack_40._8_8_ = (uv_loop_t *)0x1e158a;
      loop_hang_called = loop_hang_called + 1;
      uv_close(&client,0);
      iVar1 = uv_close(&idle_handle,0);
      return iVar1;
    }
    auStack_40._8_8_ = (uv_loop_t *)0x1e15c9;
    loop_hang_called = loop_hang_called + 1;
    iVar1 = uv_udp_send(&send_req,&client,&buf,1,&addr,send_cb);
    auStack_40._32_8_ = SEXT48(iVar1);
    auStack_40._24_8_ = (void *)0x0;
    if ((code *)auStack_40._32_8_ == (code *)0x0) {
      return iVar1;
    }
  }
  else {
    auStack_40._8_8_ = (uv_loop_t *)0x1e15f2;
    idle_cb_cold_1();
LAB_001e15f2:
    auStack_40._8_8_ = (uv_loop_t *)0x1e15f7;
    idle_cb_cold_2();
LAB_001e15f7:
    auStack_40._8_8_ = (uv_loop_t *)0x1e1606;
    idle_cb_cold_3();
  }
  puVar4 = (uv_udp_send_t *)(auStack_40 + 0x20);
  iVar1 = (int)auStack_40 + 0x18;
  auStack_40._8_8_ = send_cb;
  idle_cb_cold_4();
  auStack_40._8_8_ = unaff_RBX;
  if (puVar4 == (uv_udp_send_t *)0x0) {
    send_cb_cold_5();
LAB_001e167e:
    send_cb_cold_1();
LAB_001e1686:
    send_cb_cold_2();
  }
  else {
    if ((iVar1 != -0x65) && (iVar1 != 0)) goto LAB_001e1698;
    if (puVar4->handle != &client) goto LAB_001e167e;
    if (puVar4 != &send_req) goto LAB_001e1686;
    send_req.handle = (uv_udp_t *)0x0;
    iVar1 = uv_idle_start(&idle_handle,idle_cb);
    auStack_40._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_40._0_8_ == (void *)0x0) {
      return iVar1;
    }
  }
  puVar4 = (uv_udp_send_t *)auStack_40;
  send_cb_cold_3();
LAB_001e1698:
  send_cb_cold_4();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar4,0);
  return iVar1;
}

Assistant:

TEST_IMPL(udp_send_hang_loop) {
  ASSERT_OK(uv_idle_init(uv_default_loop(), &idle_handle));

  /* 192.0.2.0/24 is "TEST-NET" and reserved for documentation.
   * Good for us, though. Since we want to have something unreachable.
   */
  ASSERT_OK(uv_ip4_addr("192.0.2.3", TEST_PORT, &addr));

  ASSERT_OK(uv_udp_init(uv_default_loop(), &client));

  buf = uv_buf_init(send_data, sizeof(send_data));

  ASSERT_OK(uv_idle_start(&idle_handle, idle_cb));

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_GT(loop_hang_called, 1000);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}